

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableValue.cpp
# Opt level: O3

void __thiscall
VariableValue::VariableValue(VariableValue *this,PrimitiveSimpleObject *type,int value)

{
  bool bVar1;
  runtime_error *this_00;
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR_SetValue_0016c870;
  this->type_ = type;
  this->value_ = 0;
  (this->fields_)._M_h._M_buckets = &(this->fields_)._M_h._M_single_bucket;
  (this->fields_)._M_h._M_bucket_count = 1;
  (this->fields_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fields_)._M_h._M_element_count = 0;
  (this->fields_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fields_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fields_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar1 = PrimitiveSimpleObject::IsClass(type);
  if (!bVar1) {
    this->value_ = value;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Trying to set \'int\' value to Class object");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VariableValue::VariableValue(PrimitiveSimpleObject* type, int value)
    : type_(type) {
  if (type_->IsClass()) {
    throw std::runtime_error("Trying to set 'int' value to Class object");
  } else {
    value_ = value;
  }
}